

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray
          (CSharedMemoryObjectManager *this,CPalThread *pthr,HANDLE *rghHandlesToReference,
          DWORD dwHandleCount,CAllowedObjectTypes *paot,DWORD dwRightsRequired,IPalObject **rgpobjs)

{
  uint local_48;
  DWORD local_44;
  DWORD dw;
  DWORD dwRightsGranted;
  IPalObject *pobj;
  PAL_ERROR palError;
  DWORD dwRightsRequired_local;
  CAllowedObjectTypes *paot_local;
  HANDLE *ppVStack_20;
  DWORD dwHandleCount_local;
  HANDLE *rghHandlesToReference_local;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  
  pobj._0_4_ = 0;
  _dw = (IPalObject *)0x0;
  pobj._4_4_ = dwRightsRequired;
  _palError = paot;
  paot_local._4_4_ = dwHandleCount;
  ppVStack_20 = rghHandlesToReference;
  rghHandlesToReference_local = &pthr->_vptr_CPalThread;
  pthr_local = (CPalThread *)this;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a3);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (ppVStack_20 == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a4);
    fprintf(_stderr,"Expression: NULL != rghHandlesToReference\n");
  }
  if (paot_local._4_4_ == 0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a5);
    fprintf(_stderr,"Expression: 0 < dwHandleCount\n");
  }
  if (_palError == (CAllowedObjectTypes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a6);
    fprintf(_stderr,"Expression: NULL != paot\n");
  }
  if (rgpobjs == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceMultipleObjectsByHandleArray",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x3a7);
    fprintf(_stderr,"Expression: NULL != rgpobjs\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CSimpleHandleManager::Lock(&this->m_HandleManager,(CPalThread *)rghHandlesToReference_local);
  for (local_48 = 0; local_48 < paot_local._4_4_; local_48 = local_48 + 1) {
    pobj._0_4_ = CSimpleHandleManager::GetObjectFromHandle
                           (&this->m_HandleManager,(CPalThread *)rghHandlesToReference_local,
                            ppVStack_20[local_48],&local_44,(IPalObject **)&dw);
    if (((PAL_ERROR)pobj == 0) &&
       (pobj._0_4_ = CheckObjectTypeAndRights(_dw,_palError,local_44,pobj._4_4_),
       (PAL_ERROR)pobj == 0)) {
      rgpobjs[local_48] = _dw;
      _dw = (IPalObject *)0x0;
    }
    if ((PAL_ERROR)pobj != 0) break;
  }
  CSimpleHandleManager::Unlock(&this->m_HandleManager,(CPalThread *)rghHandlesToReference_local);
  if ((PAL_ERROR)pobj != 0) {
    while (local_48 != 0) {
      local_48 = local_48 - 1;
      (*rgpobjs[local_48]->_vptr_IPalObject[8])(rgpobjs[local_48],rghHandlesToReference_local);
    }
    if (_dw != (IPalObject *)0x0) {
      (*_dw->_vptr_IPalObject[8])(_dw,rghHandlesToReference_local);
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return (PAL_ERROR)pobj;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray(
    CPalThread *pthr,
    HANDLE rghHandlesToReference[],
    DWORD dwHandleCount,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequired,
    IPalObject *rgpobjs[]            // OUT (caller allocated)
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobj = NULL;
    DWORD dwRightsGranted;
    DWORD dw;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != rghHandlesToReference);
    _ASSERTE(0 < dwHandleCount);
    _ASSERTE(NULL != paot);
    _ASSERTE(NULL != rgpobjs);

    ENTRY("CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray "
        "(this=%p, pthr=%p, rghHandlesToReference=%p, dwHandleCount=%d, "
        "pAllowedTyped=%d, dwRightsRequired=%d, rgpobjs=%p)\n",
        this,
        pthr,
        rghHandlesToReference,
        dwHandleCount,
        paot,
        dwRightsRequired,
        rgpobjs
        );

    m_HandleManager.Lock(pthr);

    for (dw = 0; dw < dwHandleCount; dw += 1)
    {        
        palError = m_HandleManager.GetObjectFromHandle(
            pthr,
            rghHandlesToReference[dw],
            &dwRightsGranted,
            &pobj
            );

        if (NO_ERROR == palError)
        {
            palError = CheckObjectTypeAndRights(
                pobj,
                paot,
                dwRightsGranted,
                dwRightsRequired
                );

            if (NO_ERROR == palError)
            {
                //
                // Transfer reference to out array
                //

                rgpobjs[dw] = pobj;
                pobj = NULL;
            }
        }

        if (NO_ERROR != palError)
        {
            break;
        }
    }

    //
    // The handle manager lock must be released before releasing
    // any object references, as ReleaseReference will acquire
    // the object manager list lock (which needs to be acquired before
    // the handle manager lock)
    //

    m_HandleManager.Unlock(pthr);

    if (NO_ERROR != palError)
    {
        //
        // dw's current value is the failing index, so we want
        // to free from dw - 1.
        //
        
        while (dw > 0)
        {
            rgpobjs[--dw]->ReleaseReference(pthr);
        }

        if (NULL != pobj)
        {
            pobj->ReleaseReference(pthr);
        }
    }

    LOGEXIT("CSharedMemoryObjectManager::ReferenceMultipleObjectsByHandleArray"
        " returns %d\n",
        palError
        );

    return palError;
}